

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O2

void __thiscall
OpenMD::HBondJump::processNonOverlapping
          (HBondJump *this,int frame,SelectionManager *sman1,SelectionManager *sman2)

{
  int iVar1;
  Molecule *pMVar2;
  Molecule *pMVar3;
  HBondDonor *pHVar4;
  pointer ppAVar5;
  Atom *pAVar6;
  pointer ppHVar7;
  pointer ppAVar8;
  long lVar9;
  size_type sVar10;
  reference rVar11;
  int j;
  int i;
  int local_50;
  int local_4c;
  SelectionManager *local_48;
  long local_40;
  SelectionManager *local_38;
  
  local_48 = sman2;
  local_38 = sman1;
  pMVar2 = SelectionManager::beginSelectedMolecule(sman1,&local_4c);
  lVar9 = (long)frame;
  local_40 = lVar9 * 0x18;
  while (pMVar2 != (Molecule *)0x0) {
    pMVar3 = SelectionManager::beginSelectedMolecule(local_48,&local_50);
    while (pMVar3 != (Molecule *)0x0) {
      ppHVar7 = (pMVar2->hBondDonors_).
                super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppHVar7 !=
          (pMVar2->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0013456e;
      pHVar4 = (HBondDonor *)0x0;
      while (pHVar4 != (HBondDonor *)0x0) {
        sVar10 = (size_type)
                 *(int *)(*(long *)((long)&(((this->GIDtoH_).
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data + local_40) +
                         (long)(pHVar4->donatedHydrogen->super_StuntDouble).globalIndex_ * 4);
        iVar1 = *(int *)(*(long *)((long)&(((this->acceptor_).
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data + local_40) + sVar10 * 4);
        ppAVar8 = (pMVar3->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar5 = (pMVar3->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar8 != ppAVar5) goto LAB_00134548;
        pAVar6 = (Atom *)0x0;
        while (pAVar6 != (Atom *)0x0) {
          if ((pAVar6->super_StuntDouble).globalIndex_ == iVar1) {
            rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((this->selected_).
                                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar9,sVar10);
            *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
            ppAVar5 = (pMVar3->hBondAcceptors_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          ppAVar8 = ppAVar8 + 1;
          pAVar6 = (Atom *)0x0;
          if (ppAVar8 != ppAVar5) {
LAB_00134548:
            pAVar6 = *ppAVar8;
          }
        }
        ppHVar7 = ppHVar7 + 1;
        pHVar4 = (HBondDonor *)0x0;
        if (ppHVar7 !=
            (pMVar2->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0013456e:
          pHVar4 = *ppHVar7;
        }
      }
      ppHVar7 = (pMVar3->hBondDonors_).
                super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppHVar7 !=
          (pMVar3->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0013463d;
      pHVar4 = (HBondDonor *)0x0;
      while (pHVar4 != (HBondDonor *)0x0) {
        sVar10 = (size_type)
                 *(int *)(*(long *)((long)&(((this->GIDtoH_).
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data + local_40) +
                         (long)(pHVar4->donatedHydrogen->super_StuntDouble).globalIndex_ * 4);
        iVar1 = *(int *)(*(long *)((long)&(((this->acceptor_).
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                          super__Vector_impl_data + local_40) + sVar10 * 4);
        ppAVar8 = (pMVar2->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar5 = (pMVar2->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar8 != ppAVar5) goto LAB_0013461b;
        pAVar6 = (Atom *)0x0;
        while (pAVar6 != (Atom *)0x0) {
          if ((pAVar6->super_StuntDouble).globalIndex_ == iVar1) {
            rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((this->selected_).
                                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar9,sVar10);
            *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
            ppAVar5 = (pMVar2->hBondAcceptors_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          ppAVar8 = ppAVar8 + 1;
          pAVar6 = (Atom *)0x0;
          if (ppAVar8 != ppAVar5) {
LAB_0013461b:
            pAVar6 = *ppAVar8;
          }
        }
        ppHVar7 = ppHVar7 + 1;
        pHVar4 = (HBondDonor *)0x0;
        if (ppHVar7 !=
            (pMVar3->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0013463d:
          pHVar4 = *ppHVar7;
        }
      }
      pMVar3 = SelectionManager::nextSelectedMolecule(local_48,&local_50);
    }
    pMVar2 = SelectionManager::nextSelectedMolecule(local_38,&local_4c);
  }
  return;
}

Assistant:

void HBondJump::processNonOverlapping(int frame, SelectionManager& sman1,
                                        SelectionManager& sman2) {
    Molecule* mol1;
    Molecule* mol2;
    int i, j;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    int hInd, index, aInd;

    // This is the same as a non-overlapping pairwise loop structure:
    // for (int i = 0;  i < ni ; ++i ) {
    //   for (int j = 0; j < nj; ++j) {}
    // }

    for (mol1 = sman1.beginSelectedMolecule(i); mol1 != NULL;
         mol1 = sman1.nextSelectedMolecule(i)) {
      for (mol2 = sman2.beginSelectedMolecule(j); mol2 != NULL;
           mol2 = sman2.nextSelectedMolecule(j)) {
        // loop over the possible donors in molecule 1:
        for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol1->nextHBondDonor(hbdi)) {
          hInd  = hbd->donatedHydrogen->getGlobalIndex();
          index = GIDtoH_[frame][hInd];
          aInd  = acceptor_[frame][index];

          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }

        // loop over the possible donors in molecule 2:
        for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol2->nextHBondDonor(hbdi)) {
          hInd  = hbd->donatedHydrogen->getGlobalIndex();
          index = GIDtoH_[frame][hInd];
          aInd  = acceptor_[frame][index];

          for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol1->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }
    }
  }